

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall soul::heart::Printer::PrinterStream::printAll(PrinterStream *this)

{
  bool bVar1;
  pool_ref<soul::heart::Variable> *ppVar2;
  Variable *pVVar3;
  string *__x;
  undefined1 local_50 [8];
  Indent indent;
  pool_ref<soul::heart::Variable> *v;
  pool_ref<soul::heart::Variable> *__end2;
  pool_ref<soul::heart::Variable> *__begin2;
  undefined1 local_18 [8];
  ArrayView<soul::pool_ref<soul::heart::Variable>_> *__range2;
  PrinterStream *this_local;
  
  __range2 = (ArrayView<soul::pool_ref<soul::heart::Variable>_> *)this;
  ___begin2 = Module::StateVariables::get(&this->module->stateVariables);
  local_18 = (undefined1  [8])&__begin2;
  __end2 = ArrayView<soul::pool_ref<soul::heart::Variable>_>::begin
                     ((ArrayView<soul::pool_ref<soul::heart::Variable>_> *)local_18);
  ppVar2 = ArrayView<soul::pool_ref<soul::heart::Variable>_>::end
                     ((ArrayView<soul::pool_ref<soul::heart::Variable>_> *)local_18);
  for (; __end2 != ppVar2; __end2 = __end2 + 1) {
    indent._8_8_ = __end2;
    pVVar3 = pool_ref<soul::heart::Variable>::operator->(__end2);
    __x = Identifier::operator_cast_to_string_(&pVVar3->name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->allVisibleVariables,__x);
  }
  bVar1 = Module::isProcessor(this->module);
  if (bVar1) {
    choc::text::CodePrinter::operator<<(this->out,"processor ");
  }
  bVar1 = Module::isGraph(this->module);
  if (bVar1) {
    choc::text::CodePrinter::operator<<(this->out,"graph ");
  }
  bVar1 = Module::isNamespace(this->module);
  if (bVar1) {
    choc::text::CodePrinter::operator<<(this->out,"namespace ");
  }
  choc::text::CodePrinter::operator<<(this->out,&this->module->fullName);
  printDescription(this,&this->module->annotation);
  choc::text::CodePrinter::operator<<(this->out,(NewLine *)&newLine);
  choc::text::CodePrinter::createIndentWithBraces((CodePrinter *)local_50,(size_t)this->out);
  bVar1 = Module::isNamespace(this->module);
  if (!bVar1) {
    printInputs(this);
    printOutputs(this);
    choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  }
  printNodes(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  printConnections(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  printLatency(this);
  printStateVariables(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  printStructs(this);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  printFunctions(this);
  choc::text::CodePrinter::Indent::~Indent((Indent *)local_50);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  return;
}

Assistant:

void printAll()
        {
            for (auto& v : module.stateVariables.get())
                allVisibleVariables.push_back (v->name);

            if (module.isProcessor())   out << "processor ";
            if (module.isGraph())       out << "graph ";
            if (module.isNamespace())   out << "namespace ";

            out << module.fullName;
            printDescription (module.annotation);
            out << newLine;

            {
                auto indent = out.createIndentWithBraces (2);

                if (! module.isNamespace())
                {
                    printInputs();
                    printOutputs();
                    out << blankLine;
                }

                printNodes();
                out << blankLine;
                printConnections();
                out << blankLine;
                printLatency();
                printStateVariables();
                out << blankLine;
                printStructs();
                out << blankLine;
                printFunctions();
            }

            out << blankLine;
        }